

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::AdvanceClock::AdvanceClock(AdvanceClock *this,CodeLocation *l)

{
  CodeLocation local_28;
  CodeLocation *local_18;
  CodeLocation *l_local;
  AdvanceClock *this_local;
  
  local_18 = l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_28,l);
  Statement::Statement(&this->super_Statement,&local_28);
  CodeLocation::~CodeLocation(&local_28);
  (this->super_Statement).super_Object._vptr_Object = (_func_int **)&PTR__AdvanceClock_00641338;
  return;
}

Assistant:

AdvanceClock (CodeLocation l) : Statement (std::move (l)) {}